

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form2_Flip(FlipForm2 Flip)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint32_t width;
  uint uVar4;
  uint height;
  uint uVar5;
  uint8_t local_89;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  ImageTemplate<unsigned_char> local_58;
  
  Unit_Test::intensityArray(&intensity,2);
  local_89 = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,0,0,'\x01','\x01');
  Test_Helper::uniformImages(&input,&intensity,&local_58);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
  uVar2 = rand();
  uVar3 = rand();
  uVar5 = (input.
           super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_width;
  uVar4 = (input.
           super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_height;
  if ((uVar3 & 1) == 0) {
    if (1 < uVar4) {
      height = uVar4 >> 1;
      width = uVar5;
LAB_0013f4c6:
      Image_Function::Fill
                (input.
                 super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,0,0,width,height,local_89);
    }
  }
  else if (1 < uVar5 && (uVar2 & 1) == 0) {
    width = uVar5 >> 1;
    height = uVar4;
    goto LAB_0013f4c6;
  }
  (*Flip)(input.
          super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
          ._M_impl.super__Vector_impl_data._M_start,
          input.
          super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
          ._M_impl.super__Vector_impl_data._M_start + 1,(uVar2 & 1) == 0,(uVar3 & 1) == 0);
  if ((uVar3 & 1) == 0) {
    bVar1 = Unit_Test::verifyImage
                      (input.
                       super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1,0,0,
                       input.
                       super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1]._width,
                       (input.
                        super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._height >> 1) + (uVar4 & 1),
                       *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
    if (bVar1) {
      if (1 < (input.
               super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_height) {
        uVar5 = input.
                super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_start[1]._height >> 1;
        bVar1 = Unit_Test::verifyImage
                          (input.
                           super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1,0,(uVar4 & 1) + uVar5,
                           input.
                           super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1]._width,uVar5,local_89);
LAB_0013f5ab:
        if (bVar1 == false) goto LAB_0013f5b3;
      }
LAB_0013f5af:
      bVar1 = true;
      goto LAB_0013f5b5;
    }
  }
  else {
    bVar1 = Unit_Test::verifyImage
                      (input.
                       super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1,0,0,
                       (input.
                        super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[1]._width >> 1) + (uVar5 & 1),
                       input.
                       super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1]._height,
                       *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
    if (bVar1) {
      if (1 < (input.
               super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_width) {
        uVar4 = input.
                super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_start[1]._width >> 1;
        if ((uVar2 & 1) != 0) {
          local_89 = *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        }
        bVar1 = Unit_Test::verifyImage
                          (input.
                           super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1,(uVar5 & 1) + uVar4,0,uVar4
                           ,input.
                            super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._height,local_89);
        goto LAB_0013f5ab;
      }
      goto LAB_0013f5af;
    }
  }
LAB_0013f5b3:
  bVar1 = false;
LAB_0013f5b5:
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&input);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar1;
}

Assistant:

bool form2_Flip(FlipForm2 Flip)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const uint8_t intensityFill = intensityValue();
        std::vector < PenguinV_Image::Image > input = uniformImages( intensity );

        const bool horizontalFlip = (randomValue<uint32_t>( 0, 2 ) == 0);
        const bool verticalFlip = (randomValue<uint32_t>( 0, 2 ) == 0);
        const uint32_t xCorrection = input[0].width() % 2;
        const uint32_t yCorrection = input[0].height() % 2;

        if (verticalFlip)
        {
            if (input[0].height() > 1)
                Image_Function::Fill(input[0], 0, 0, input[0].width(), input[0].height() / 2, intensityFill);
        }
        else if (horizontalFlip)
        {
            if (input[0].width() > 1)
                Image_Function::Fill(input[0], 0, 0, input[0].width() / 2, input[0].height(), intensityFill);
        }

        Flip( input[0], input[1], horizontalFlip, verticalFlip );

        if (verticalFlip) {
            if( !verifyImage( input[1], 0, 0, input[1].width(), input[1].height() / 2 + yCorrection, intensity[0] ) )
                return false;
            if((input[0].height() > 1) && !verifyImage( input[1], 0, input[1].height() / 2 + yCorrection, input[1].width(), input[1].height() / 2, intensityFill ) )
                return false;
        }
        else {
            if( !verifyImage( input[1], 0, 0, input[1].width() / 2 + xCorrection, input[1].height(), intensity[0] ) )
                return false;
            if((input[0].width() > 1) && !verifyImage( input[1], input[1].width() / 2 + xCorrection, 0, input[1].width() / 2, input[1].height(),
                                                       horizontalFlip ? intensityFill : intensity[0] ) )
                return false;
        }

        return true;
    }